

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::beckmann::cdf2(beckmann *this,float_t tx,float_t zi,float_t z_i)

{
  float extraout_XMM0_Da;
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  float_t tmp2;
  float_t tmp1;
  float_t sigma_i;
  float_t z_i_local;
  float_t zi_local;
  float_t tx_local;
  beckmann *this_local;
  undefined1 extraout_var [12];
  
  z_i_local = tx;
  _zi_local = this;
  (*(this->super_radial).super_microfacet.super_brdf._vptr_brdf[0xf])();
  fVar1 = sqr<float>(&z_i_local);
  dVar2 = std::exp((double)(ulong)(uint)-fVar1);
  auVar5._0_4_ = m_pi();
  auVar5._4_12_ = extraout_var;
  dVar3 = std::sqrt(auVar5._0_8_);
  dVar4 = std::erf((double)(ulong)(uint)z_i_local);
  return ((z_i * SUB84(dVar2,0)) / (SUB84(dVar3,0) * 2.0) + (zi * (SUB84(dVar4,0) + 1.0)) / 2.0) /
         extraout_XMM0_Da;
}

Assistant:

float_t beckmann::cdf2(float_t tx, float_t zi, float_t z_i) const
{
	float_t sigma_i = sigma_std_radial(zi);
	float_t tmp1 = z_i * exp(-sqr(tx)) / (2 * sqrt(m_pi()));
	float_t tmp2 = zi * (std::erf(tx) + 1) / 2;

	return (tmp1 + tmp2) / sigma_i;
}